

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall
Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*,unsigned_int,char_const*>
          (Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2,
          uint msg_3,char *msg_4)

{
  Exception *in_RDX;
  string *in_R9;
  uint in_stack_0000013c;
  char *in_stack_00000140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000148;
  char *in_stack_00000150;
  Exception *in_stack_00000158;
  char *in_stack_00000170;
  string local_70 [32];
  string local_50 [32];
  string *local_30;
  
  local_30 = in_R9;
  std::__cxx11::string::string(local_70,(string *)in_RDX);
  toString<char_const*,std::__cxx11::string,char_const*,unsigned_int,char_const*>
            (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
             in_stack_0000013c,in_stack_00000170);
  Exception(in_RDX,local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }